

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O2

void jtransform_execute_transform
               (j_decompress_ptr srcinfo,j_compress_ptr dstinfo,jvirt_barray_ptr *src_coef_arrays,
               jpeg_transform_info *info)

{
  JCOEF JVar1;
  uint uVar2;
  JDIMENSION JVar3;
  JDIMENSION JVar4;
  JDIMENSION JVar5;
  uint uVar6;
  jvirt_barray_ptr *ppjVar7;
  j_decompress_ptr pjVar8;
  jpeg_component_info *pjVar9;
  uint uVar10;
  JCROP_CODE JVar11;
  int iVar12;
  jpeg_memory_mgr *pjVar13;
  JBLOCKROW paJVar14;
  JBLOCKARRAY ppaJVar15;
  JBLOCKARRAY ppaJVar16;
  JBLOCKROW paJVar17;
  short sVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  size_t sVar22;
  JDIMENSION JVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  uint uVar27;
  JBLOCKROW paJVar28;
  jvirt_barray_ptr pjVar29;
  JCOEF *pJVar30;
  uint uVar31;
  uint uVar32;
  JCOEF *pJVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  uint uVar37;
  int iVar38;
  int iVar39;
  JCOEF *pJVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  uint uVar46;
  ulong uVar47;
  bool bVar48;
  
  if (JXFORM_DROP < info->transform) {
    return;
  }
  ppjVar7 = info->workspace_coef_arrays;
  switch(info->transform) {
  case JXFORM_NONE:
    uVar6 = srcinfo->output_width;
    if (uVar6 < info->output_width) {
      if (info->crop_width_set == JCROP_FORCE) {
        JVar3 = info->x_crop_offset;
        JVar4 = info->y_crop_offset;
        iVar12 = dstinfo->max_h_samp_factor;
        iVar39 = dstinfo->max_v_samp_factor;
        lVar26 = 0;
        uVar27 = srcinfo->output_height;
        do {
          if (dstinfo->num_components <= lVar26) {
            return;
          }
          pjVar9 = dstinfo->comp_info;
          uVar43 = pjVar9[lVar26].v_samp_factor;
          uVar21 = (ulong)uVar43;
          uVar44 = pjVar9[lVar26].h_samp_factor * (uVar6 / (uint)(iVar12 << 3));
          uVar41 = pjVar9[lVar26].h_samp_factor * JVar3;
          uVar24 = (ulong)uVar41;
          uVar46 = uVar43 * JVar4;
          uVar41 = uVar41 + uVar44;
          for (uVar19 = 0; uVar19 < pjVar9[lVar26].height_in_blocks; uVar19 = uVar19 + (int)uVar21)
          {
            ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar19,(JDIMENSION)uVar21,1
                                  );
            if (srcinfo->output_height < dstinfo->image_height) {
              if ((uVar46 <= uVar19) && (uVar19 < uVar43 * (uVar27 / (uint)(iVar39 << 3) + JVar4)))
              {
                pjVar13 = srcinfo->mem;
                pjVar29 = src_coef_arrays[lVar26];
                uVar31 = -uVar46;
                goto LAB_001098d4;
              }
              for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
                  lVar25 = lVar25 + 1) {
                memset(ppaJVar15[lVar25],0,(ulong)pjVar9[lVar26].width_in_blocks << 7);
              }
            }
            else {
              pjVar13 = srcinfo->mem;
              pjVar29 = src_coef_arrays[lVar26];
              uVar31 = uVar46;
LAB_001098d4:
              ppaJVar16 = (*pjVar13->access_virt_barray)
                                    ((j_common_ptr)srcinfo,pjVar29,uVar19 + uVar31,
                                     pjVar9[lVar26].v_samp_factor,0);
              for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
                  lVar25 = lVar25 + 1) {
                if (uVar24 == 0) {
                  paJVar14 = ppaJVar16[lVar25];
                  paJVar17 = ppaJVar15[lVar25];
                }
                else {
                  memset(ppaJVar15[lVar25],0,uVar24 * 0x80);
                  paJVar14 = ppaJVar16[lVar25];
                  JVar1 = (*paJVar14)[0];
                  paJVar17 = ppaJVar15[lVar25];
                  for (sVar22 = 0; uVar24 * 0x80 != sVar22; sVar22 = sVar22 + 0x80) {
                    *(JCOEF *)((long)*paJVar17 + sVar22) = JVar1;
                  }
                }
                jcopy_block_row(paJVar14,paJVar17 + uVar24,uVar44);
                if (uVar41 < pjVar9[lVar26].width_in_blocks) {
                  memset(ppaJVar15[lVar25] + uVar24 + uVar44,0,
                         (ulong)(pjVar9[lVar26].width_in_blocks - uVar41) << 7);
                  JVar1 = ppaJVar16[lVar25][uVar44 - 1][0];
                  uVar31 = pjVar9[lVar26].width_in_blocks;
                  for (uVar21 = (ulong)uVar41; uVar21 < uVar31; uVar21 = uVar21 + 1) {
                    ppaJVar15[lVar25][uVar21][0] = JVar1;
                  }
                }
              }
            }
          }
          lVar26 = lVar26 + 1;
        } while( true );
      }
      if (info->crop_width_set == JCROP_REFLECT) {
        JVar3 = info->x_crop_offset;
        JVar4 = info->y_crop_offset;
        iVar12 = dstinfo->max_h_samp_factor;
        iVar39 = dstinfo->max_v_samp_factor;
        lVar26 = 0;
        uVar27 = srcinfo->output_height;
        do {
          if (dstinfo->num_components <= lVar26) {
            return;
          }
          pjVar9 = dstinfo->comp_info;
          uVar43 = pjVar9[lVar26].v_samp_factor;
          uVar21 = (ulong)uVar43;
          uVar19 = pjVar9[lVar26].h_samp_factor * (uVar6 / (uint)(iVar12 << 3));
          uVar41 = pjVar9[lVar26].h_samp_factor * JVar3;
          uVar24 = (ulong)uVar41;
          uVar44 = uVar43 * JVar4;
          for (uVar46 = 0; uVar46 < pjVar9[lVar26].height_in_blocks; uVar46 = uVar46 + (int)uVar21)
          {
            ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar46,(JDIMENSION)uVar21,1
                                  );
            if (srcinfo->output_height < dstinfo->image_height) {
              if ((uVar44 <= uVar46) && (uVar46 < uVar43 * (uVar27 / (uint)(iVar39 << 3) + JVar4)))
              {
                pjVar13 = srcinfo->mem;
                pjVar29 = src_coef_arrays[lVar26];
                uVar31 = -uVar44;
                goto LAB_001080d5;
              }
              for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
                  lVar25 = lVar25 + 1) {
                memset(ppaJVar15[lVar25],0,(ulong)pjVar9[lVar26].width_in_blocks << 7);
              }
            }
            else {
              pjVar13 = srcinfo->mem;
              pjVar29 = src_coef_arrays[lVar26];
              uVar31 = uVar44;
LAB_001080d5:
              ppaJVar16 = (*pjVar13->access_virt_barray)
                                    ((j_common_ptr)srcinfo,pjVar29,uVar46 + uVar31,
                                     pjVar9[lVar26].v_samp_factor,0);
              for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
                  lVar25 = lVar25 + 1) {
                jcopy_block_row(ppaJVar16[lVar25],ppaJVar15[lVar25] + uVar24,uVar19);
                if (uVar41 != 0) {
                  paJVar14 = ppaJVar15[lVar25] + uVar24;
                  uVar21 = uVar24;
                  while (paJVar17 = paJVar14, paJVar14 = paJVar17, uVar31 = uVar19, (int)uVar21 != 0
                        ) {
                    while( true ) {
                      if ((uVar31 == 0) || ((int)uVar21 == 0)) break;
                      for (lVar36 = 0; (uint)lVar36 < 0x40; lVar36 = lVar36 + 2) {
                        paJVar14[-1][lVar36] = (*paJVar17)[lVar36];
                        paJVar14[-1][lVar36 + 1] = -(*paJVar17)[lVar36 + 1];
                      }
                      paJVar17 = paJVar17 + 1;
                      uVar21 = (ulong)((int)uVar21 - 1);
                      paJVar14 = paJVar14 + -1;
                      uVar31 = uVar31 - 1;
                    }
                  }
                }
                iVar38 = pjVar9[lVar26].width_in_blocks - (uVar19 + uVar41);
                if (uVar19 + uVar41 <= pjVar9[lVar26].width_in_blocks && iVar38 != 0) {
                  paJVar14 = ppaJVar15[lVar25] + uVar24 + uVar19;
                  while (uVar21 = (ulong)uVar19, paJVar17 = paJVar14, iVar38 != 0) {
                    while( true ) {
                      if (((int)uVar21 == 0) || (iVar38 == 0)) break;
                      for (lVar36 = 0; (uint)lVar36 < 0x40; lVar36 = lVar36 + 2) {
                        (*paJVar14)[lVar36] = paJVar17[-1][lVar36];
                        (*paJVar14)[lVar36 + 1] = -paJVar17[-1][lVar36 + 1];
                      }
                      paJVar14 = paJVar14 + 1;
                      uVar21 = (ulong)((int)uVar21 - 1);
                      paJVar17 = paJVar17 + -1;
                      iVar38 = iVar38 + -1;
                    }
                  }
                }
              }
            }
          }
          lVar26 = lVar26 + 1;
        } while( true );
      }
      uVar27 = srcinfo->output_height;
    }
    else {
      uVar27 = srcinfo->output_height;
      if (info->output_height <= uVar27) {
        JVar3 = info->x_crop_offset;
        JVar4 = info->y_crop_offset;
        if (JVar3 == 0 && JVar4 == 0) {
          return;
        }
        for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
          pjVar9 = dstinfo->comp_info;
          iVar12 = pjVar9[lVar26].h_samp_factor;
          uVar6 = pjVar9[lVar26].v_samp_factor;
          uVar21 = (ulong)uVar6;
          for (uVar27 = 0; uVar27 < pjVar9[lVar26].height_in_blocks;
              uVar27 = uVar27 + pjVar9[lVar26].v_samp_factor) {
            ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar27,(JDIMENSION)uVar21,1
                                  );
            ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],
                                   uVar27 + uVar6 * JVar4,pjVar9[lVar26].v_samp_factor,0);
            lVar25 = 0;
            while( true ) {
              uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
              if ((long)uVar21 <= lVar25) break;
              jcopy_block_row(ppaJVar16[lVar25] + iVar12 * JVar3,ppaJVar15[lVar25],
                              pjVar9[lVar26].width_in_blocks);
              lVar25 = lVar25 + 1;
            }
          }
        }
        return;
      }
    }
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    iVar12 = dstinfo->max_h_samp_factor;
    iVar39 = dstinfo->max_v_samp_factor;
    for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
      pjVar9 = dstinfo->comp_info;
      uVar43 = pjVar9[lVar26].v_samp_factor;
      uVar21 = (ulong)uVar43;
      uVar19 = pjVar9[lVar26].h_samp_factor * (uVar6 / (uint)(iVar12 << 3));
      uVar46 = pjVar9[lVar26].h_samp_factor * JVar3;
      uVar24 = (ulong)uVar46;
      uVar44 = uVar43 * JVar4;
      uVar46 = uVar46 + uVar19;
      for (uVar41 = 0; uVar41 < pjVar9[lVar26].height_in_blocks; uVar41 = uVar41 + (int)uVar21) {
        ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar41,(JDIMENSION)uVar21,1);
        if (srcinfo->output_height < dstinfo->image_height) {
          if ((uVar44 <= uVar41) && (uVar41 < uVar43 * (uVar27 / (uint)(iVar39 << 3) + JVar4))) {
            pjVar13 = srcinfo->mem;
            pjVar29 = src_coef_arrays[lVar26];
            uVar31 = -uVar44;
            goto LAB_00109b17;
          }
          for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
              lVar25 = lVar25 + 1) {
            memset(ppaJVar15[lVar25],0,(ulong)pjVar9[lVar26].width_in_blocks << 7);
          }
        }
        else {
          pjVar13 = srcinfo->mem;
          pjVar29 = src_coef_arrays[lVar26];
          uVar31 = uVar44;
LAB_00109b17:
          ppaJVar16 = (*pjVar13->access_virt_barray)
                                ((j_common_ptr)srcinfo,pjVar29,uVar41 + uVar31,
                                 pjVar9[lVar26].v_samp_factor,0);
          for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
              lVar25 = lVar25 + 1) {
            if (srcinfo->output_width < dstinfo->image_width) {
              if (uVar24 != 0) {
                memset(ppaJVar15[lVar25],0,uVar24 * 0x80);
              }
              jcopy_block_row(ppaJVar16[lVar25],ppaJVar15[lVar25] + uVar24,uVar19);
              uVar31 = pjVar9[lVar26].width_in_blocks - uVar46;
              if (uVar46 <= pjVar9[lVar26].width_in_blocks && uVar31 != 0) {
                memset(ppaJVar15[lVar25] + uVar24 + uVar19,0,(ulong)uVar31 << 7);
              }
            }
            else {
              jcopy_block_row(ppaJVar16[lVar25] + uVar24,ppaJVar15[lVar25],
                              pjVar9[lVar26].width_in_blocks);
            }
          }
        }
      }
    }
    break;
  case JXFORM_FLIP_H:
    JVar3 = info->y_crop_offset;
    if ((JVar3 == 0) && (info->slow_hflip == 0)) {
      JVar3 = info->x_crop_offset;
      uVar6 = srcinfo->output_width;
      iVar12 = dstinfo->max_h_samp_factor;
      for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
        pjVar9 = dstinfo->comp_info;
        uVar44 = pjVar9[lVar26].h_samp_factor * (uVar6 / (uint)(iVar12 << 3));
        uVar27 = pjVar9[lVar26].h_samp_factor * JVar3;
        for (uVar43 = 0; uVar43 < pjVar9[lVar26].height_in_blocks;
            uVar43 = pjVar9[lVar26].v_samp_factor + uVar43) {
          ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],uVar43,
                                 pjVar9[lVar26].v_samp_factor,1);
          for (lVar25 = 0; lVar25 < pjVar9[lVar26].v_samp_factor; lVar25 = lVar25 + 1) {
            lVar36 = 0;
            for (lVar20 = 0; (ulong)(lVar20 * 2) < (ulong)uVar44; lVar20 = lVar20 + 1) {
              paJVar14 = ppaJVar15[lVar25];
              pJVar30 = paJVar14[~(uint)lVar20 + uVar44];
              for (lVar35 = 0; (uint)lVar35 < 0x40; lVar35 = lVar35 + 2) {
                JVar1 = *(JCOEF *)((long)*paJVar14 + lVar35 * 2 + lVar36);
                *(JCOEF *)((long)*paJVar14 + lVar35 * 2 + lVar36) = *pJVar30;
                *pJVar30 = JVar1;
                sVar18 = *(short *)((long)*paJVar14 + lVar35 * 2 + lVar36 + 2);
                *(JCOEF *)((long)*paJVar14 + lVar35 * 2 + lVar36 + 2) = -pJVar30[1];
                pJVar30[1] = -sVar18;
                pJVar30 = pJVar30 + 2;
              }
              lVar36 = lVar36 + 0x80;
            }
            if (uVar27 != 0) {
              lVar36 = 0;
              for (uVar21 = 0; uVar21 < pjVar9[lVar26].width_in_blocks; uVar21 = uVar21 + 1) {
                paJVar14 = (JBLOCKROW)((long)*ppaJVar15[lVar25] + lVar36);
                jcopy_block_row(paJVar14 + uVar27,paJVar14,1);
                lVar36 = lVar36 + 0x80;
              }
            }
          }
        }
      }
    }
    else {
      JVar4 = info->x_crop_offset;
      uVar6 = srcinfo->output_width;
      iVar12 = dstinfo->max_h_samp_factor;
      for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
        pjVar9 = dstinfo->comp_info;
        uVar27 = pjVar9[lVar26].v_samp_factor;
        uVar21 = (ulong)uVar27;
        uVar46 = pjVar9[lVar26].h_samp_factor * (uVar6 / (uint)(iVar12 << 3));
        uVar43 = pjVar9[lVar26].h_samp_factor * JVar4;
        for (uVar44 = 0; uVar44 < pjVar9[lVar26].height_in_blocks;
            uVar44 = uVar44 + pjVar9[lVar26].v_samp_factor) {
          ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar44,(JDIMENSION)uVar21,1);
          ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],
                                 uVar27 * JVar3 + uVar44,pjVar9[lVar26].v_samp_factor,0);
          lVar25 = 0;
          while( true ) {
            uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
            if ((long)uVar21 <= lVar25) break;
            paJVar14 = ppaJVar15[lVar25];
            paJVar17 = ppaJVar16[lVar25];
            paJVar28 = paJVar14;
            for (uVar21 = 0; uVar21 < pjVar9[lVar26].width_in_blocks; uVar21 = uVar21 + 1) {
              uVar41 = (int)uVar21 + uVar43;
              if (uVar41 < uVar46) {
                pJVar30 = paJVar17[~uVar41 + uVar46];
                for (lVar36 = 0; (uint)lVar36 < 0x40; lVar36 = lVar36 + 2) {
                  (*paJVar28)[lVar36] = *pJVar30;
                  (*paJVar28)[lVar36 + 1] = -pJVar30[1];
                  pJVar30 = pJVar30 + 2;
                }
              }
              else {
                jcopy_block_row(paJVar17 + uVar43 + uVar21,paJVar14 + uVar21,1);
              }
              paJVar28 = paJVar28 + 1;
            }
            lVar25 = lVar25 + 1;
          }
        }
      }
    }
    break;
  case JXFORM_FLIP_V:
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    uVar6 = srcinfo->output_height;
    iVar12 = dstinfo->max_v_samp_factor;
    for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
      pjVar9 = dstinfo->comp_info;
      uVar27 = pjVar9[lVar26].v_samp_factor;
      uVar24 = (ulong)uVar27;
      uVar43 = uVar27 * (uVar6 / (uint)(iVar12 << 3));
      uVar21 = (ulong)(pjVar9[lVar26].h_samp_factor * JVar3);
      for (uVar44 = 0; uVar44 < pjVar9[lVar26].height_in_blocks; uVar44 = uVar44 + iVar39) {
        ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar44,(JDIMENSION)uVar24,1);
        uVar46 = uVar44 + uVar27 * JVar4;
        JVar23 = (uVar43 - uVar46) - pjVar9[lVar26].v_samp_factor;
        if (uVar43 <= uVar46) {
          JVar23 = uVar46;
        }
        ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],JVar23,
                               pjVar9[lVar26].v_samp_factor,0);
        lVar25 = 0;
        while( true ) {
          iVar39 = pjVar9[lVar26].v_samp_factor;
          uVar24 = (ulong)iVar39;
          if ((long)uVar24 <= lVar25) break;
          if (uVar46 < uVar43) {
            paJVar14 = ppaJVar15[lVar25];
            paJVar17 = ppaJVar16[(int)(~(uint)lVar25 + iVar39)];
            uVar41 = pjVar9[lVar26].width_in_blocks;
            for (uVar24 = 0; uVar24 != uVar41; uVar24 = uVar24 + 1) {
              pJVar30 = paJVar14[uVar24];
              pJVar33 = paJVar17[uVar21 + uVar24];
              for (uVar19 = 0; uVar19 < 8; uVar19 = uVar19 + 2) {
                lVar36 = 0;
                for (lVar20 = 0; (int)lVar20 != 8; lVar20 = lVar20 + 1) {
                  pJVar30[lVar20] = pJVar33[lVar20];
                  lVar36 = lVar36 + -2;
                }
                pJVar33 = (JCOEF *)((long)pJVar33 - lVar36);
                pJVar30 = (JCOEF *)((long)pJVar30 - lVar36);
                iVar39 = 8;
                while (bVar48 = iVar39 != 0, iVar39 = iVar39 + -1, bVar48) {
                  sVar18 = *pJVar33;
                  pJVar33 = pJVar33 + 1;
                  *pJVar30 = -sVar18;
                  pJVar30 = pJVar30 + 1;
                }
              }
            }
          }
          else {
            jcopy_block_row(ppaJVar16[lVar25] + uVar21,ppaJVar15[lVar25],
                            pjVar9[lVar26].width_in_blocks);
          }
          lVar25 = lVar25 + 1;
        }
      }
    }
    break;
  case JXFORM_TRANSPOSE:
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
      pjVar9 = dstinfo->comp_info;
      iVar12 = pjVar9[lVar26].h_samp_factor;
      uVar6 = pjVar9[lVar26].v_samp_factor;
      uVar21 = (ulong)uVar6;
      for (uVar27 = 0; uVar27 < pjVar9[lVar26].height_in_blocks;
          uVar27 = uVar27 + pjVar9[lVar26].v_samp_factor) {
        ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar27,(JDIMENSION)uVar21,1);
        uVar43 = uVar6 * JVar4 + uVar27;
        lVar25 = 0;
        while( true ) {
          uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
          if ((long)uVar21 <= lVar25) break;
          uVar21 = 0;
          while (uVar44 = (uint)uVar21, uVar44 < pjVar9[lVar26].width_in_blocks) {
            ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],
                                   iVar12 * JVar3 + uVar44,pjVar9[lVar26].h_samp_factor,0);
            uVar46 = pjVar9[lVar26].h_samp_factor;
            uVar24 = 0;
            if (0 < (int)uVar46) {
              uVar24 = (ulong)uVar46;
            }
            for (uVar34 = 0; uVar34 != uVar24; uVar34 = uVar34 + 1) {
              pJVar33 = ppaJVar16[uVar34][uVar43];
              pJVar30 = ppaJVar15[lVar25][uVar21];
              for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
                for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 2) {
                  pJVar30[lVar20 * 4] = *(JCOEF *)((long)pJVar33 + lVar20);
                }
                pJVar33 = pJVar33 + 8;
                pJVar30 = pJVar30 + 1;
              }
              uVar21 = (ulong)((int)uVar21 + 1);
            }
            uVar21 = (ulong)(uVar46 + uVar44);
          }
          lVar25 = lVar25 + 1;
          uVar43 = uVar43 + 1;
        }
      }
    }
    break;
  case JXFORM_TRANSVERSE:
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    uVar6 = srcinfo->output_width;
    uVar27 = srcinfo->output_height;
    iVar12 = dstinfo->max_h_samp_factor;
    iVar39 = dstinfo->max_v_samp_factor;
    for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
      pjVar9 = dstinfo->comp_info;
      iVar38 = pjVar9[lVar26].h_samp_factor;
      uVar43 = pjVar9[lVar26].v_samp_factor;
      uVar21 = (ulong)uVar43;
      uVar44 = iVar38 * (uVar27 / (uint)(iVar12 << 3));
      uVar46 = uVar43 * (uVar6 / (uint)(iVar39 << 3));
      for (uVar41 = 0; uVar41 < pjVar9[lVar26].height_in_blocks;
          uVar41 = uVar41 + pjVar9[lVar26].v_samp_factor) {
        ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar41,(JDIMENSION)uVar21,1);
        uVar31 = uVar43 * JVar4 + uVar41;
        lVar25 = 0;
        uVar19 = uVar31;
        while( true ) {
          uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
          if ((long)uVar21 <= lVar25) break;
          uVar10 = ~(uVar31 + (int)lVar25) + uVar46;
          uVar21 = 0;
          while (uVar32 = (uint)uVar21, uVar32 < pjVar9[lVar26].width_in_blocks) {
            uVar37 = uVar32 + iVar38 * JVar3;
            JVar23 = (uVar44 - uVar37) - pjVar9[lVar26].h_samp_factor;
            if (uVar44 <= uVar37) {
              JVar23 = uVar37;
            }
            ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],JVar23,
                                   pjVar9[lVar26].h_samp_factor,0);
            uVar2 = pjVar9[lVar26].h_samp_factor;
            uVar24 = 0;
            if (0 < (int)uVar2) {
              uVar24 = (ulong)uVar2;
            }
            for (uVar34 = 0; uVar34 != uVar24; uVar34 = uVar34 + 1) {
              paJVar14 = ppaJVar15[lVar25];
              if (uVar31 < uVar46) {
                if (uVar37 < uVar44) {
                  paJVar17 = ppaJVar16[(int)(~(uint)uVar34 + uVar2)];
                  pJVar33 = paJVar14[uVar21] + 8;
                  pJVar30 = paJVar14[uVar21] + 9;
                  for (uVar47 = 0; uVar47 < 8; uVar47 = uVar47 + 2) {
                    pJVar40 = pJVar33;
                    for (uVar45 = 0; uVar45 < 8; uVar45 = uVar45 + 2) {
                      uVar42 = uVar45 | uVar47 * 8;
                      (*(JBLOCK *)(pJVar40 + -8))[0] = paJVar17[uVar10][uVar42];
                      *pJVar40 = -*(short *)((long)paJVar17[uVar10] + (uVar42 * 2 | 2));
                      pJVar40 = pJVar40 + 0x10;
                    }
                    pJVar40 = pJVar30;
                    for (uVar45 = 0; uVar45 < 8; uVar45 = uVar45 + 2) {
                      uVar42 = uVar45 | uVar47 * 8 + 8;
                      pJVar40[-8] = -paJVar17[uVar10][uVar42];
                      *pJVar40 = *(JCOEF *)((long)paJVar17[uVar10] + (uVar42 * 2 | 2));
                      pJVar40 = pJVar40 + 0x10;
                    }
                    pJVar33 = pJVar33 + 2;
                    pJVar30 = pJVar30 + 2;
                  }
                }
                else {
                  paJVar17 = ppaJVar16[uVar34];
                  pJVar30 = paJVar14[uVar21] + 8;
                  for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
                    pJVar33 = pJVar30;
                    for (uVar47 = 0; uVar47 < 8; uVar47 = uVar47 + 2) {
                      uVar45 = uVar47 | lVar36 * 8;
                      (*(JBLOCK *)(pJVar33 + -8))[0] = paJVar17[uVar10][uVar45];
                      *pJVar33 = -*(short *)((long)paJVar17[uVar10] + (uVar45 * 2 | 2));
                      pJVar33 = pJVar33 + 0x10;
                    }
                    pJVar30 = pJVar30 + 1;
                  }
                }
              }
              else if (uVar37 < uVar44) {
                pJVar33 = ppaJVar16[(int)(~(uint)uVar34 + uVar2)][uVar19];
                pJVar30 = paJVar14[uVar21];
                for (uVar47 = 0; uVar47 < 8; uVar47 = uVar47 + 2) {
                  for (lVar36 = 0; lVar20 = 0x10, lVar36 != 0x10; lVar36 = lVar36 + 2) {
                    pJVar30[lVar36 * 4] = *(JCOEF *)((long)pJVar33 + lVar36);
                  }
                  for (; lVar20 != 0x20; lVar20 = lVar20 + 2) {
                    pJVar30[lVar20 * 4 + -0x3f] = -*(short *)((long)pJVar33 + lVar20);
                  }
                  pJVar33 = pJVar33 + 0x10;
                  pJVar30 = pJVar30 + 2;
                }
              }
              else {
                pJVar33 = ppaJVar16[uVar34][uVar19];
                pJVar30 = paJVar14[uVar21];
                for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
                  for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 2) {
                    pJVar30[lVar20 * 4] = *(JCOEF *)((long)pJVar33 + lVar20);
                  }
                  pJVar33 = pJVar33 + 8;
                  pJVar30 = pJVar30 + 1;
                }
              }
              uVar21 = (ulong)((int)uVar21 + 1);
            }
            uVar21 = (ulong)(uVar2 + uVar32);
          }
          lVar25 = lVar25 + 1;
          uVar19 = uVar19 + 1;
        }
      }
    }
    break;
  case JXFORM_ROT_90:
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    uVar6 = srcinfo->output_height;
    iVar12 = dstinfo->max_h_samp_factor;
    for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
      pjVar9 = dstinfo->comp_info;
      iVar39 = pjVar9[lVar26].h_samp_factor;
      uVar27 = pjVar9[lVar26].v_samp_factor;
      uVar21 = (ulong)uVar27;
      uVar43 = iVar39 * (uVar6 / (uint)(iVar12 << 3));
      for (uVar44 = 0; uVar44 < pjVar9[lVar26].height_in_blocks;
          uVar44 = uVar44 + pjVar9[lVar26].v_samp_factor) {
        ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar44,(JDIMENSION)uVar21,1);
        uVar46 = uVar27 * JVar4 + uVar44;
        lVar25 = 0;
        while( true ) {
          uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
          if ((long)uVar21 <= lVar25) break;
          uVar21 = 0;
          while (uVar41 = (uint)uVar21, uVar41 < pjVar9[lVar26].width_in_blocks) {
            uVar19 = uVar41 + iVar39 * JVar3;
            JVar23 = (uVar43 - uVar19) - pjVar9[lVar26].h_samp_factor;
            if (uVar43 <= uVar19) {
              JVar23 = uVar19;
            }
            ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],JVar23,
                                   pjVar9[lVar26].h_samp_factor,0);
            uVar31 = pjVar9[lVar26].h_samp_factor;
            uVar24 = 0;
            if (0 < (int)uVar31) {
              uVar24 = (ulong)uVar31;
            }
            for (uVar34 = 0; uVar34 != uVar24; uVar34 = uVar34 + 1) {
              if (uVar19 < uVar43) {
                pJVar33 = ppaJVar16[(int)(~(uint)uVar34 + uVar31)][uVar46];
                pJVar30 = ppaJVar15[lVar25][uVar21];
                for (uVar47 = 0; uVar47 < 8; uVar47 = uVar47 + 2) {
                  for (lVar36 = 0; lVar20 = 0x10, lVar36 != 0x10; lVar36 = lVar36 + 2) {
                    pJVar30[lVar36 * 4] = *(JCOEF *)((long)pJVar33 + lVar36);
                  }
                  for (; lVar20 != 0x20; lVar20 = lVar20 + 2) {
                    pJVar30[lVar20 * 4 + -0x3f] = -*(short *)((long)pJVar33 + lVar20);
                  }
                  pJVar33 = pJVar33 + 0x10;
                  pJVar30 = pJVar30 + 2;
                }
              }
              else {
                pJVar33 = ppaJVar16[uVar34][uVar46];
                pJVar30 = ppaJVar15[lVar25][uVar21];
                for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
                  for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 2) {
                    pJVar30[lVar20 * 4] = *(JCOEF *)((long)pJVar33 + lVar20);
                  }
                  pJVar33 = pJVar33 + 8;
                  pJVar30 = pJVar30 + 1;
                }
              }
              uVar21 = (ulong)((int)uVar21 + 1);
            }
            uVar21 = (ulong)(uVar31 + uVar41);
          }
          lVar25 = lVar25 + 1;
          uVar46 = uVar46 + 1;
        }
      }
    }
    break;
  case JXFORM_ROT_180:
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    iVar12 = dstinfo->max_h_samp_factor;
    iVar39 = dstinfo->max_v_samp_factor;
    uVar6 = srcinfo->output_width;
    uVar27 = srcinfo->output_height;
    for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
      pjVar9 = dstinfo->comp_info;
      uVar43 = pjVar9[lVar26].v_samp_factor;
      uVar21 = (ulong)uVar43;
      uVar19 = pjVar9[lVar26].h_samp_factor * (uVar6 / (uint)(iVar12 << 3));
      uVar44 = uVar43 * (uVar27 / (uint)(iVar39 << 3));
      uVar46 = pjVar9[lVar26].h_samp_factor * JVar3;
      for (uVar41 = 0; uVar41 < pjVar9[lVar26].height_in_blocks; uVar41 = uVar41 + iVar38) {
        ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar41,(JDIMENSION)uVar21,1);
        uVar31 = uVar43 * JVar4 + uVar41;
        JVar23 = (uVar44 - uVar31) - pjVar9[lVar26].v_samp_factor;
        if (uVar44 <= uVar31) {
          JVar23 = uVar31;
        }
        ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],JVar23,
                               pjVar9[lVar26].v_samp_factor,0);
        lVar25 = 0;
        while( true ) {
          iVar38 = pjVar9[lVar26].v_samp_factor;
          uVar21 = (ulong)iVar38;
          if ((long)uVar21 <= lVar25) break;
          paJVar14 = ppaJVar15[lVar25];
          if (uVar31 < uVar44) {
            paJVar17 = ppaJVar16[(int)(~(uint)lVar25 + iVar38)];
            uVar10 = pjVar9[lVar26].width_in_blocks;
            for (uVar21 = 0; uVar21 != uVar10; uVar21 = uVar21 + 1) {
              pJVar30 = paJVar14[uVar21];
              uVar32 = uVar46 + (int)uVar21;
              if (uVar32 < uVar19) {
                pJVar33 = paJVar17[~uVar32 + uVar19];
                for (uVar32 = 0; uVar32 < 8; uVar32 = uVar32 + 2) {
                  for (uVar37 = 0; uVar37 < 8; uVar37 = uVar37 + 2) {
                    *pJVar30 = *pJVar33;
                    pJVar40 = pJVar33 + 1;
                    pJVar33 = pJVar33 + 2;
                    pJVar30[1] = -*pJVar40;
                    pJVar30 = pJVar30 + 2;
                  }
                  for (uVar37 = 0; uVar37 < 8; uVar37 = uVar37 + 2) {
                    *pJVar30 = -*pJVar33;
                    pJVar40 = pJVar33 + 1;
                    pJVar33 = pJVar33 + 2;
                    pJVar30[1] = *pJVar40;
                    pJVar30 = pJVar30 + 2;
                  }
                }
              }
              else {
                pJVar33 = paJVar17[uVar32];
                for (uVar32 = 0; uVar32 < 8; uVar32 = uVar32 + 2) {
                  lVar36 = 0;
                  for (lVar20 = 0; (int)lVar20 != 8; lVar20 = lVar20 + 1) {
                    pJVar30[lVar20] = pJVar33[lVar20];
                    lVar36 = lVar36 + -2;
                  }
                  pJVar33 = (JCOEF *)((long)pJVar33 - lVar36);
                  pJVar30 = (JCOEF *)((long)pJVar30 - lVar36);
                  iVar38 = 8;
                  while (bVar48 = iVar38 != 0, iVar38 = iVar38 + -1, bVar48) {
                    sVar18 = *pJVar33;
                    pJVar33 = pJVar33 + 1;
                    *pJVar30 = -sVar18;
                    pJVar30 = pJVar30 + 1;
                  }
                }
              }
            }
          }
          else {
            paJVar17 = ppaJVar16[lVar25];
            paJVar28 = paJVar14;
            for (uVar21 = 0; uVar21 < pjVar9[lVar26].width_in_blocks; uVar21 = uVar21 + 1) {
              uVar10 = uVar46 + (int)uVar21;
              if (uVar10 < uVar19) {
                pJVar30 = paJVar17[~uVar10 + uVar19];
                for (lVar36 = 0; (uint)lVar36 < 0x40; lVar36 = lVar36 + 2) {
                  (*paJVar28)[lVar36] = *pJVar30;
                  (*paJVar28)[lVar36 + 1] = -pJVar30[1];
                  pJVar30 = pJVar30 + 2;
                }
              }
              else {
                jcopy_block_row(paJVar17 + uVar46 + uVar21,paJVar14 + uVar21,1);
              }
              paJVar28 = paJVar28 + 1;
            }
          }
          lVar25 = lVar25 + 1;
        }
      }
    }
    break;
  case JXFORM_ROT_270:
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    uVar6 = srcinfo->output_width;
    iVar12 = dstinfo->max_v_samp_factor;
    for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
      pjVar9 = dstinfo->comp_info;
      uVar27 = pjVar9[lVar26].v_samp_factor;
      uVar21 = (ulong)uVar27;
      uVar44 = uVar27 * (uVar6 / (uint)(iVar12 << 3));
      iVar39 = pjVar9[lVar26].h_samp_factor;
      for (uVar43 = 0; uVar43 < pjVar9[lVar26].height_in_blocks;
          uVar43 = uVar43 + pjVar9[lVar26].v_samp_factor) {
        ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                              ((j_common_ptr)srcinfo,ppjVar7[lVar26],uVar43,(JDIMENSION)uVar21,1);
        uVar41 = uVar43 + uVar27 * JVar4;
        lVar25 = 0;
        uVar46 = uVar41;
        while( true ) {
          uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
          if ((long)uVar21 <= lVar25) break;
          uVar19 = ~(uVar41 + (int)lVar25) + uVar44;
          uVar21 = 0;
          while (uVar31 = (uint)uVar21, uVar31 < pjVar9[lVar26].width_in_blocks) {
            ppaJVar16 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],
                                   uVar31 + iVar39 * JVar3,pjVar9[lVar26].h_samp_factor,0);
            uVar10 = pjVar9[lVar26].h_samp_factor;
            uVar24 = 0;
            if (0 < (int)uVar10) {
              uVar24 = (ulong)uVar10;
            }
            for (uVar34 = 0; uVar34 != uVar24; uVar34 = uVar34 + 1) {
              paJVar14 = ppaJVar16[uVar34];
              if (uVar41 < uVar44) {
                pJVar30 = ppaJVar15[lVar25][uVar21] + 8;
                for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
                  pJVar33 = pJVar30;
                  for (uVar47 = 0; uVar47 < 8; uVar47 = uVar47 + 2) {
                    uVar45 = uVar47 | lVar36 * 8;
                    (*(JBLOCK *)(pJVar33 + -8))[0] = paJVar14[uVar19][uVar45];
                    *pJVar33 = -*(short *)((long)paJVar14[uVar19] + (uVar45 * 2 | 2));
                    pJVar33 = pJVar33 + 0x10;
                  }
                  pJVar30 = pJVar30 + 1;
                }
              }
              else {
                pJVar30 = paJVar14[uVar46];
                pJVar33 = ppaJVar15[lVar25][uVar21];
                for (lVar36 = 0; lVar36 != 8; lVar36 = lVar36 + 1) {
                  for (lVar20 = 0; lVar20 != 0x10; lVar20 = lVar20 + 2) {
                    pJVar33[lVar20 * 4] = *(JCOEF *)((long)pJVar30 + lVar20);
                  }
                  pJVar30 = pJVar30 + 8;
                  pJVar33 = pJVar33 + 1;
                }
              }
              uVar21 = (ulong)((int)uVar21 + 1);
            }
            uVar21 = (ulong)(uVar10 + uVar31);
          }
          lVar25 = lVar25 + 1;
          uVar46 = uVar46 + 1;
        }
      }
    }
    break;
  case JXFORM_WIPE:
    JVar11 = info->crop_width_set;
    if (JVar11 == JCROP_REFLECT) {
      if ((info->y_crop_offset == 0) &&
         (JVar3 = info->drop_height,
         lVar26 = jdiv_round_up((ulong)info->output_height,(long)info->iMCU_sample_height),
         JVar3 == (JDIMENSION)lVar26)) {
        JVar3 = info->x_crop_offset;
        if (JVar3 == 0) {
          JVar3 = 0;
LAB_00109e36:
          JVar4 = info->drop_width;
          JVar23 = info->drop_height;
          for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
            pjVar9 = dstinfo->comp_info;
            uVar6 = pjVar9[lVar26].v_samp_factor;
            uVar21 = (ulong)uVar6;
            uVar44 = pjVar9[lVar26].h_samp_factor * JVar3;
            uVar27 = pjVar9[lVar26].h_samp_factor * JVar4;
            uVar24 = (ulong)uVar27;
            for (uVar43 = 0; uVar43 < uVar6 * JVar23; uVar43 = uVar43 + pjVar9[lVar26].v_samp_factor
                ) {
              ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],uVar43,
                                     (JDIMENSION)uVar21,1);
              lVar25 = 0;
              while( true ) {
                uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
                if ((long)uVar21 <= lVar25) break;
                if (uVar44 == 0) {
                  iVar12 = pjVar9[lVar26].width_in_blocks - uVar27;
                  if (pjVar9[lVar26].width_in_blocks < uVar27 || iVar12 == 0) {
                    memset(ppaJVar15[lVar25],0,uVar24 * 0x80);
                  }
                  else {
                    paJVar14 = ppaJVar15[lVar25] + uVar24;
                    uVar21 = uVar24;
                    while (paJVar17 = paJVar14, iVar39 = iVar12, (int)uVar21 != 0) {
                      while( true ) {
                        if ((iVar39 == 0) || ((int)uVar21 == 0)) break;
                        for (lVar36 = 0; (uint)lVar36 < 0x40; lVar36 = lVar36 + 2) {
                          paJVar14[-1][lVar36] = (*paJVar17)[lVar36];
                          paJVar14[-1][lVar36 + 1] = -(*paJVar17)[lVar36 + 1];
                        }
                        uVar21 = (ulong)((int)uVar21 - 1);
                        paJVar14 = paJVar14 + -1;
                        paJVar17 = paJVar17 + 1;
                        iVar39 = iVar39 + -1;
                      }
                    }
                  }
                }
                else {
                  paJVar14 = ppaJVar15[lVar25] + uVar44;
                  uVar21 = uVar24;
                  while (paJVar17 = paJVar14, paJVar14 = paJVar17, uVar34 = (ulong)uVar44,
                        (int)uVar21 != 0) {
                    while( true ) {
                      if (((int)uVar34 == 0) || ((int)uVar21 == 0)) break;
                      for (lVar36 = 0; (uint)lVar36 < 0x40; lVar36 = lVar36 + 2) {
                        (*paJVar14)[lVar36] = paJVar17[-1][lVar36];
                        (*paJVar14)[lVar36 + 1] = -paJVar17[-1][lVar36 + 1];
                      }
                      uVar21 = (ulong)((int)uVar21 - 1);
                      paJVar17 = paJVar17 + -1;
                      paJVar14 = paJVar14 + 1;
                      uVar34 = (ulong)((int)uVar34 - 1);
                    }
                  }
                }
                lVar25 = lVar25 + 1;
              }
            }
          }
          return;
        }
        JVar4 = info->drop_width;
        lVar26 = jdiv_round_up((ulong)info->output_width,(long)info->iMCU_sample_width);
        if (JVar3 + JVar4 == (int)lVar26) {
          JVar3 = info->x_crop_offset;
          goto LAB_00109e36;
        }
      }
      JVar11 = info->crop_width_set;
    }
    JVar3 = info->x_crop_offset;
    JVar4 = info->y_crop_offset;
    iVar12 = info->drop_height + JVar4;
    JVar23 = info->drop_width;
    lVar26 = 0;
    if (JVar11 == JCROP_FORCE) {
      for (; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
        pjVar9 = dstinfo->comp_info;
        uVar6 = pjVar9[lVar26].v_samp_factor;
        uVar21 = (ulong)uVar6;
        uVar43 = pjVar9[lVar26].h_samp_factor * JVar3;
        uVar24 = (ulong)uVar43;
        uVar27 = pjVar9[lVar26].h_samp_factor * JVar23;
        uVar46 = uVar27 + uVar43;
        uVar34 = (ulong)uVar46;
        for (uVar44 = uVar6 * JVar4; uVar44 < uVar6 * iVar12;
            uVar44 = uVar44 + pjVar9[lVar26].v_samp_factor) {
          ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],uVar44,
                                 (JDIMENSION)uVar21,1);
          lVar25 = 0;
          while( true ) {
            uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
            if ((long)uVar21 <= lVar25) break;
            memset(ppaJVar15[lVar25] + uVar24,0,(ulong)uVar27 << 7);
            if (uVar24 == 0) {
              if (uVar46 < pjVar9[lVar26].width_in_blocks) {
                paJVar14 = ppaJVar15[lVar25];
                sVar18 = paJVar14[uVar34][0];
                goto LAB_001096bc;
              }
            }
            else {
              paJVar14 = ppaJVar15[lVar25];
              sVar18 = paJVar14[uVar43 - 1][0];
              if (uVar46 < pjVar9[lVar26].width_in_blocks) {
                sVar18 = (short)((uint)((int)paJVar14[uVar34][0] + (int)sVar18) >> 1);
              }
LAB_001096bc:
              paJVar14 = paJVar14 + uVar24;
              for (uVar21 = uVar24; uVar21 < uVar34; uVar21 = uVar21 + 1) {
                (*paJVar14)[0] = sVar18;
                paJVar14 = paJVar14 + 1;
              }
            }
            lVar25 = lVar25 + 1;
          }
        }
      }
    }
    else {
      for (; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
        pjVar9 = dstinfo->comp_info;
        iVar39 = pjVar9[lVar26].h_samp_factor;
        uVar6 = pjVar9[lVar26].v_samp_factor;
        uVar21 = (ulong)uVar6;
        for (uVar27 = uVar6 * JVar4; uVar27 < uVar6 * iVar12;
            uVar27 = uVar27 + pjVar9[lVar26].v_samp_factor) {
          ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],uVar27,
                                 (JDIMENSION)uVar21,1);
          lVar25 = 0;
          while( true ) {
            uVar21 = (ulong)pjVar9[lVar26].v_samp_factor;
            if ((long)uVar21 <= lVar25) break;
            memset(ppaJVar15[lVar25] + iVar39 * JVar3,0,(ulong)(iVar39 * JVar23) << 7);
            lVar25 = lVar25 + 1;
          }
        }
      }
    }
    break;
  case JXFORM_DROP:
    JVar3 = info->drop_width;
    if ((JVar3 != 0) && (JVar4 = info->drop_height, JVar4 != 0)) {
      JVar23 = info->x_crop_offset;
      JVar5 = info->y_crop_offset;
      pjVar8 = info->drop_ptr;
      ppjVar7 = info->drop_coef_arrays;
      for (lVar26 = 0; lVar26 < dstinfo->num_components; lVar26 = lVar26 + 1) {
        pjVar9 = dstinfo->comp_info;
        uVar6 = pjVar9[lVar26].v_samp_factor;
        uVar21 = (ulong)uVar6;
        uVar43 = pjVar9[lVar26].h_samp_factor * JVar3;
        uVar44 = pjVar9[lVar26].h_samp_factor * JVar23;
        for (uVar27 = 0; uVar27 < uVar6 * JVar4; uVar27 = uVar27 + (int)uVar21) {
          ppaJVar15 = (*srcinfo->mem->access_virt_barray)
                                ((j_common_ptr)srcinfo,src_coef_arrays[lVar26],
                                 uVar6 * JVar5 + uVar27,(JDIMENSION)uVar21,1);
          if (lVar26 < pjVar8->num_components) {
            ppaJVar16 = (*pjVar8->mem->access_virt_barray)
                                  ((j_common_ptr)pjVar8,ppjVar7[lVar26],uVar27,
                                   pjVar9[lVar26].v_samp_factor,0);
            for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
                lVar25 = lVar25 + 1) {
              jcopy_block_row(ppaJVar16[lVar25],ppaJVar15[lVar25] + uVar44,uVar43);
            }
          }
          else {
            for (lVar25 = 0; uVar21 = (ulong)pjVar9[lVar26].v_samp_factor, lVar25 < (long)uVar21;
                lVar25 = lVar25 + 1) {
              memset(ppaJVar15[lVar25] + uVar44,0,(ulong)uVar43 << 7);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jtransform_execute_transform(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                             jvirt_barray_ptr *src_coef_arrays,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *dst_coef_arrays = info->workspace_coef_arrays;

  /* Note: conditions tested here should match those in switch statement
   * in jtransform_request_workspace()
   */
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height) {
      if (info->output_width > srcinfo->output_width &&
          info->crop_width_set == JCROP_REFLECT)
        do_crop_ext_reflect(srcinfo, dstinfo,
                            info->x_crop_offset, info->y_crop_offset,
                            src_coef_arrays, dst_coef_arrays);
      else if (info->output_width > srcinfo->output_width &&
               info->crop_width_set == JCROP_FORCE)
        do_crop_ext_flat(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
      else
        do_crop_ext_zero(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
    } else if (info->x_crop_offset != 0 || info->y_crop_offset != 0)
      do_crop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_FLIP_H:
    if (info->y_crop_offset != 0 || info->slow_hflip)
      do_flip_h(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                src_coef_arrays, dst_coef_arrays);
    else
      do_flip_h_no_crop(srcinfo, dstinfo, info->x_crop_offset,
                        src_coef_arrays);
    break;
  case JXFORM_FLIP_V:
    do_flip_v(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSPOSE:
    do_transpose(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSVERSE:
    do_transverse(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                  src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_90:
    do_rot_90(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_180:
    do_rot_180(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_270:
    do_rot_270(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_WIPE:
    if (info->crop_width_set == JCROP_REFLECT &&
        info->y_crop_offset == 0 && info->drop_height ==
        (JDIMENSION)jdiv_round_up
          ((long)info->output_height, (long)info->iMCU_sample_height) &&
        (info->x_crop_offset == 0 ||
         info->x_crop_offset + info->drop_width ==
         (JDIMENSION)jdiv_round_up
           ((long)info->output_width, (long)info->iMCU_sample_width)))
      do_reflect(srcinfo, dstinfo, info->x_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else if (info->crop_width_set == JCROP_FORCE)
      do_flatten(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else
      do_wipe(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_width, info->drop_height);
    break;
  case JXFORM_DROP:
    if (info->drop_width != 0 && info->drop_height != 0)
      do_drop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_ptr, info->drop_coef_arrays,
              info->drop_width, info->drop_height);
    break;
  }
}